

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spritesheet.cc
# Opt level: O2

vector<Image,_std::allocator<Image>_> *
LoadCgaSpritesheet(vector<Image,_std::allocator<Image>_> *__return_storage_ptr__,string *filename)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_28;
  
  ReadBinaryFile((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&_Stack_28,filename);
  anon_unknown.dwarf_49a1::LoadCgaSpritesheet
            (__return_storage_ptr__,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&_Stack_28);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_28);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Image> LoadCgaSpritesheet(std::string const& filename) {
  auto const data = ReadBinaryFile(filename);
  return LoadCgaSpritesheet(data);
}